

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void sprint_long_canframe(char *buf,canfd_frame *cf,int view,int maxdlen)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  __u8 *p_Var5;
  byte bVar6;
  byte bVar7;
  __u8 _Var8;
  int iVar9;
  canid_t id;
  char cVar10;
  char *pcVar11;
  byte *pbVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  can_frame *ccf;
  uint uVar16;
  
  uVar16 = (uint)cf->len;
  if (maxdlen <= (int)(uint)cf->len) {
    uVar16 = maxdlen;
  }
  builtin_strncpy(buf,"               ",0xf);
  uVar1 = cf->can_id;
  lVar14 = 10;
  if ((uVar1 >> 0x1d & 1) == 0) {
    if ((int)uVar1 < 0) {
      id = uVar1 & 0x1fffffff;
      goto LAB_00101975;
    }
    if ((view & 0x10U) == 0) {
      _put_id(buf,2,uVar1 & 0x7ff);
      lVar14 = 5;
      goto LAB_00101980;
    }
    id = uVar1 & 0x7ff;
    iVar3 = 2;
    pcVar11 = buf + 5;
  }
  else {
    id = uVar1 & 0x3fffffff;
LAB_00101975:
    iVar3 = 7;
    pcVar11 = buf;
  }
  _put_id(pcVar11,iVar3,id);
LAB_00101980:
  iVar3 = (int)lVar14;
  if (maxdlen == 8) {
    bVar6 = (byte)uVar16;
    if ((view & 0x20U) == 0) {
      buf[lVar14 + 1] = '[';
      bVar6 = bVar6 | 0x30;
      cVar10 = ']';
    }
    else {
      bVar7 = cf->__res1;
      if (6 < (byte)(cf->__res1 - 9)) {
        bVar7 = bVar6;
      }
      if (uVar16 != 8) {
        bVar7 = bVar6;
      }
      buf[lVar14 + 1] = '{';
      bVar6 = "0123456789ABCDEF"[bVar7];
      cVar10 = '}';
    }
    buf[lVar14 + 2] = bVar6;
    buf[lVar14 + 3] = cVar10;
    if ((cf->can_id & 0x40000000) != 0) {
      builtin_strncpy(buf + lVar14 + 5," remote request",0x10);
      return;
    }
  }
  else {
    buf[lVar14] = '[';
    buf[lVar14 + 1] = (char)((int)uVar16 / 10) + '0';
    buf[lVar14 + 2] = (char)((int)uVar16 % 10) + '0';
    buf[lVar14 + 3] = ']';
  }
  if ((view & 2U) == 0) {
    if ((view & 4U) == 0) {
      uVar13 = (ulong)(iVar3 + 5);
      uVar2 = 0;
      uVar4 = 0;
      if (0 < (int)uVar16) {
        uVar4 = (ulong)uVar16;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        buf[uVar13] = ' ';
        bVar6 = cf->data[uVar2];
        buf[uVar13 + 1] = "0123456789ABCDEF"[bVar6 >> 4];
        buf[uVar13 + 2] = "0123456789ABCDEF"[bVar6 & 0xf];
        uVar13 = uVar13 + 3;
      }
    }
    else {
      uVar13 = (ulong)(iVar3 + 5);
      for (iVar3 = 0; uVar1 = (uVar16 - 1) + iVar3, -1 < (int)uVar1; iVar3 = iVar3 + -1) {
        buf[uVar13] = (iVar3 != 0) << 6 | 0x20;
        bVar6 = cf->data[uVar1];
        buf[uVar13 + 1] = "0123456789ABCDEF"[bVar6 >> 4];
        buf[uVar13 + 2] = "0123456789ABCDEF"[bVar6 & 0xf];
        uVar13 = uVar13 + 3;
      }
    }
    iVar3 = (int)uVar13;
    iVar9 = 3;
  }
  else {
    iVar3 = iVar3 + 5;
    if ((view & 4U) == 0) {
      uVar13 = 0;
      uVar2 = 0;
      if (0 < (int)uVar16) {
        uVar2 = (ulong)uVar16;
      }
      iVar9 = 9;
      for (; uVar13 != uVar2; uVar13 = uVar13 + 1) {
        lVar14 = (long)iVar3;
        buf[lVar14] = ' ';
        pbVar12 = (byte *)(buf + lVar14 + 1);
        for (lVar15 = 0; lVar14 - (iVar3 + 8) != lVar15; lVar15 = lVar15 + -1) {
          *pbVar12 = (cf->data[uVar13] >> ((int)lVar15 + 7U & 0x1f) & 1) == 0 ^ 0x31;
          pbVar12 = pbVar12 + 1;
        }
        iVar3 = (iVar3 - (int)lVar15) + 1;
      }
    }
    else {
      iVar9 = 9;
      for (uVar1 = uVar16 - 1; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
        lVar14 = (long)iVar3;
        buf[lVar14] = (uVar1 != uVar16 - 1) << 6 | 0x20;
        pbVar12 = (byte *)(buf + lVar14 + 1);
        for (lVar15 = 0; lVar14 - (iVar3 + 8) != lVar15; lVar15 = lVar15 + -1) {
          *pbVar12 = (cf->data[uVar1] >> ((int)lVar15 + 7U & 0x1f) & 1) == 0 ^ 0x31;
          pbVar12 = pbVar12 + 1;
        }
        iVar3 = (iVar3 - (int)lVar15) + 1;
      }
    }
  }
  buf[iVar3] = '\0';
  if ((int)uVar16 < 9) {
    pcVar11 = buf + iVar3;
    if ((cf->can_id & 0x20000000) != 0) {
      sprintf(pcVar11,"%*s",(ulong)(iVar9 * (8 - uVar16) + 0xd),"ERRORFRAME");
      return;
    }
    if ((view & 1U) != 0) {
      iVar9 = iVar9 * (8 - uVar16);
      uVar1 = iVar9 + 4;
      lVar14 = (long)(iVar9 + iVar3 + 4);
      if ((view & 4U) == 0) {
        uVar13 = 0;
        sprintf(pcVar11,"%*s",(ulong)uVar1,"\'");
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        lVar15 = lVar14 << 0x20;
        for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
          _Var8 = cf->data[uVar13];
          if (0x5e < (byte)(_Var8 - 0x20)) {
            _Var8 = '.';
          }
          buf[uVar13 + lVar14] = _Var8;
          lVar15 = lVar15 + 0x100000000;
        }
        (buf + (lVar15 >> 0x20))[0] = '\'';
        (buf + (lVar15 >> 0x20))[1] = '\0';
      }
      else {
        sprintf(pcVar11,"%*s",(ulong)uVar1,"`");
        p_Var5 = (__u8 *)(buf + lVar14);
        lVar14 = lVar14 << 0x20;
        for (uVar13 = (ulong)uVar16; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
          _Var8 = cf->data[uVar13 - 1];
          if (0x5e < (byte)(_Var8 - 0x20)) {
            _Var8 = '.';
          }
          *p_Var5 = _Var8;
          lVar14 = lVar14 + 0x100000000;
          p_Var5 = p_Var5 + 1;
        }
        (buf + (lVar14 >> 0x20))[0] = '`';
        (buf + (lVar14 >> 0x20))[1] = '\0';
      }
    }
  }
  return;
}

Assistant:

void sprint_long_canframe(char *buf , struct canfd_frame *cf, int view, int maxdlen) {
	/* documentation see lib.h */

	int i, j, dlen, offset;
	int len = (cf->len > maxdlen)? maxdlen : cf->len;

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cf->can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cf->can_id & (CAN_ERR_MASK|CAN_ERR_FLAG));
		offset = 10;
	} else if (cf->can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cf->can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cf->can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cf->can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized by maxdlen (see above) */
	if (maxdlen == CAN_MAX_DLEN) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			struct can_frame *ccf = (struct can_frame *)cf;
			unsigned char dlc = ccf->len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cf->can_id & CAN_RTR_FLAG) {
			sprintf(buf+offset+5, " remote request");
			return;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len/10) + '0';
		buf[offset + 2] = (len%10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		dlen = 9; /* _10101010 */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len-1)?' ':SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		}
	} else {
		dlen = 3; /* _AA */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len-1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return;

	if (cf->can_id & CAN_ERR_FLAG)
		sprintf(buf+offset, "%*s", dlen*(8-len)+13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen*(8-len)+4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf+offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "`");
		} else {
			sprintf(buf+offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "'");
		}
	}
}